

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> **ppcVar1;
  complex<double> *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  complex<double> *pcVar7;
  complex<double> *__z;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined8 uVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  long local_78;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  TPZSkylMatrix<std::complex<double>_> *local_38;
  undefined4 extraout_var_00;
  
  lVar4 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar4 != CONCAT44(extraout_var,iVar3)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
    lVar8 = 0;
    local_78 = 0;
    local_38 = this;
    do {
      if (lVar4 < 1) {
        lVar10 = 0;
      }
      else {
        lVar6 = 8;
        lVar9 = 0;
        do {
          if (((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar9) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_78)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar8;
          lVar10 = lVar9;
          if (((*(double *)(B->fElem->_M_value + lVar6 + -8 + lVar5) != 0.0) ||
              (dVar11 = *(double *)(B->fElem->_M_value + lVar6 + lVar5), dVar11 != 0.0)) ||
             (NAN(dVar11))) break;
          lVar9 = lVar9 + 1;
          lVar6 = lVar6 + 0x10;
          lVar10 = lVar4;
        } while (lVar4 != lVar9);
      }
      if (lVar10 < lVar4) {
        lVar6 = lVar10 * 0x10 + -0x10;
        do {
          ppcVar1 = (this->fElem).fStore;
          pcVar2 = ppcVar1[lVar10 + 1];
          if (((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar10) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_78)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar7 = ppcVar1[lVar10] + 1;
          dVar11 = 0.0;
          dVar13 = 0.0;
          if (pcVar7 < pcVar2) {
            __z = (complex<double> *)
                  (B->fElem->_M_value +
                  (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar8 +
                  lVar6);
            dVar11 = 0.0;
            dVar13 = 0.0;
            do {
              local_48._8_4_ = SUB84(dVar13,0);
              local_48._0_8_ = dVar11;
              local_48._12_4_ = (int)((ulong)dVar13 >> 0x20);
              local_58 = *(double *)pcVar7->_M_value;
              local_50 = -*(double *)(pcVar7->_M_value + 8);
              std::complex<double>::operator*=((complex<double> *)&local_58,__z);
              dVar11 = (double)local_48._0_8_ + local_58;
              dVar13 = (double)local_48._8_8_ + local_50;
              pcVar7 = pcVar7 + 1;
              __z = __z + -1;
            } while (pcVar7 < pcVar2);
          }
          this = local_38;
          if (((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar10) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_78)) {
            local_48._8_4_ = SUB84(dVar13,0);
            local_48._0_8_ = dVar11;
            local_48._12_4_ = (int)((ulong)dVar13 >> 0x20);
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * local_78;
          pcVar2 = B->fElem;
          lVar9 = lVar10 + 1;
          dVar11 = *(double *)pcVar2[lVar5 + lVar10]._M_value - dVar11;
          dVar13 = *(double *)(pcVar2[lVar5 + lVar10]._M_value + 8) - dVar13;
          *(double *)pcVar2[lVar5 + lVar10]._M_value = dVar11;
          *(double *)(pcVar2[lVar5 + lVar10]._M_value + 8) = dVar13;
          pcVar7 = (local_38->fElem).fStore[lVar10];
          uVar14 = SUB84(dVar13,0);
          uVar15 = (undefined4)((ulong)dVar13 >> 0x20);
          uVar12 = __divdc3(dVar11,uVar14,*(undefined8 *)pcVar7->_M_value,
                            *(undefined8 *)(pcVar7->_M_value + 8));
          *(undefined8 *)pcVar2[lVar5 + lVar10]._M_value = uVar12;
          *(ulong *)(pcVar2[lVar5 + lVar10]._M_value + 8) = CONCAT44(uVar15,uVar14);
          lVar6 = lVar6 + 0x10;
          lVar10 = lVar9;
        } while (lVar9 != lVar4);
      }
      local_78 = local_78 + 1;
      lVar8 = lVar8 + 0x10;
    } while (local_78 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}